

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferWriteTests.cpp
# Opt level: O1

vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *
deqp::gles3::Functional::addRangeToList
          (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
           *__return_storage_ptr__,
          vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *oldList,
          IVec2 *newRange)

{
  int iVar1;
  value_type *__x;
  value_type *pvVar2;
  value_type *pvVar3;
  int iVar4;
  int iVar5;
  value_type *__x_00;
  IVec2 curRange;
  value_type local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x_00 = (oldList->super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (oldList->super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((__x_00 != pvVar3) &&
     (__x = __x_00, __x_00->m_data[1] + __x_00->m_data[0] < newRange->m_data[0])) {
    do {
      __x_00 = __x + 1;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                (__return_storage_ptr__,__x);
      pvVar3 = (oldList->
               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (__x_00 == pvVar3) break;
      pvVar2 = __x + 1;
      __x = __x_00;
    } while (pvVar2->m_data[1] + __x_00->m_data[0] < newRange->m_data[0]);
  }
  local_28.m_data = *&newRange->m_data;
  for (; __x_00 != pvVar3; __x_00 = __x_00 + 1) {
    iVar1 = __x_00->m_data[0];
    iVar4 = __x_00->m_data[1] + iVar1;
    if (((local_28.m_data[0] < iVar1 || iVar4 < local_28.m_data[0]) &&
        (iVar5 = local_28.m_data[1] + local_28.m_data[0],
        iVar4 < local_28.m_data[0] || iVar5 < iVar4)) &&
       (iVar5 < iVar1 || iVar1 < local_28.m_data[0] && iVar4 < iVar5)) break;
    if (local_28.m_data[0] < iVar1) {
      iVar1 = local_28.m_data[0];
    }
    iVar5 = local_28.m_data[0] + local_28.m_data[1];
    if (local_28.m_data[0] + local_28.m_data[1] <= iVar4) {
      iVar5 = iVar4;
    }
    local_28.m_data[1] = iVar5 - iVar1;
    local_28.m_data[0] = iVar1;
  }
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
            (__return_storage_ptr__,&local_28);
  for (; __x_00 != (oldList->
                   super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish; __x_00 = __x_00 + 1) {
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
              (__return_storage_ptr__,__x_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<tcu::IVec2> addRangeToList (const std::vector<tcu::IVec2>& oldList, const tcu::IVec2& newRange)
{
	DE_ASSERT(newRange.y() > 0);

	std::vector<tcu::IVec2>					newList;
	std::vector<tcu::IVec2>::const_iterator	oldListIter	= oldList.begin();

	// Append ranges that end before the new range.
	for (; oldListIter != oldList.end() && oldListIter->x()+oldListIter->y() < newRange.x(); ++oldListIter)
		newList.push_back(*oldListIter);

	// Join any ranges that intersect new range
	{
		tcu::IVec2 curRange = newRange;
		while (oldListIter != oldList.end() && rangesIntersect(curRange, *oldListIter))
		{
			curRange = unionRanges(curRange, *oldListIter);
			++oldListIter;
		}

		newList.push_back(curRange);
	}

	// Append remaining ranges.
	for (; oldListIter != oldList.end(); oldListIter++)
		newList.push_back(*oldListIter);

	DE_ASSERT(isRangeListValid(newList.begin(), newList.end()));

	return newList;
}